

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++:48:11)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:48:11)>
          *this,ExceptionOrValue *output)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  Exception *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar4;
  ulong uVar5;
  Fault f;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_420;
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool local_3e8;
  ArrayPtr<const_unsigned_char> local_3d8;
  NullableValue<capnp::MessageReaderAndFds> local_3c8;
  ExceptionOr<kj::Promise<void>_> local_3a0;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_3a0,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_3a0.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3a0)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3a0);
  }
  else if (depResult.value.ptr.isSet == true) {
    Maybe<capnp::MessageReaderAndFds>::Maybe
              ((Maybe<capnp::MessageReaderAndFds> *)&local_3c8,&depResult.value.ptr.field_1.value);
    if (local_3c8.isSet != true) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x3c,FAILED,(char *)0x0,"\"Reading first message failed\"",
                 (char (*) [29])"Reading first message failed");
      Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.left = local_3c8.field_1.value.fds.size_;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_3c8.field_1.value.fds.size_ == 0;
    if (local_3c8.field_1.value.fds.size_ != 0) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x32,FAILED,"result.fds.size() == 0","_kjCondition,",&_kjCondition);
      Debug::Fault::fatal(&f);
    }
    iVar3 = (*(local_3c8.field_1.value.reader.ptr)->_vptr_MessageReader[2])
                      (local_3c8.field_1.value.reader.ptr,
                       (ulong)(uint)((this->func).originalSegments)->size_);
    _kjCondition.left = CONCAT44(extraout_var,iVar3);
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
    _kjCondition.result = true;
    _kjCondition._33_7_ = 0;
    if (extraout_RDX != 0) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<capnp::word_const>,decltype(nullptr)>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x33,FAILED,"result.reader->getSegment(originalSegments.size()) == nullptr",
                 "_kjCondition,",
                 (DebugComparison<kj::ArrayPtr<const_capnp::word>,_std::nullptr_t> *)&_kjCondition);
      Debug::Fault::fatal(&f);
    }
    lVar4 = 8;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    for (uVar5 = 0; pAVar1 = (this->func).originalSegments, uVar5 < pAVar1->size_; uVar5 = uVar5 + 1
        ) {
      pEVar2 = *(Exception **)((long)pAVar1->ptr + lVar4 + -8);
      iVar3 = (*(local_3c8.field_1.value.reader.ptr)->_vptr_MessageReader[2])
                        (local_3c8.field_1.value.reader.ptr,uVar5 & 0xffffffff);
      local_3d8.ptr = (uchar *)CONCAT44(extraout_var_00,iVar3);
      local_3d8.size_ = extraout_RDX_00 << 3;
      f.exception = pEVar2;
      DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
                ((DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<const_unsigned_char>_>
                  *)&_kjCondition,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&f,
                 &local_3d8);
      if (local_3e8 == false) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                   ,0x38,FAILED,"oldSegment.asBytes() == newSegment.asBytes()","_kjCondition,",
                   (DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<const_unsigned_char>_>
                    *)&_kjCondition);
        Debug::Fault::fatal(&f);
      }
      lVar4 = lVar4 + 0x10;
    }
    ReadyNow::operator_cast_to_Promise((ReadyNow *)&local_420.value);
    NullableValue<capnp::MessageReaderAndFds>::~NullableValue(&local_3c8);
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a0.value.ptr.isSet = true;
    local_3a0.value.ptr.field_1 = local_420;
    local_420 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3a0)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3a0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_420.value);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }